

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_draw(wchar_t x,wchar_t y,wchar_t a,wchar_t c)

{
  errr eVar1;
  
  eVar1 = -1;
  if ((((L'\xffffffff' < x) && (x < Term->wid)) && (L'\xffffffff' < y)) && (y < Term->hgt)) {
    if (c == L'\0') {
      eVar1 = -2;
    }
    else {
      eVar1 = 0;
      Term_queue_char(Term,x,y,a,c,L'\0',L'\0');
    }
  }
  return eVar1;
}

Assistant:

errr Term_draw(int x, int y, int a, wchar_t c)
{
	int w = Term->wid;
	int h = Term->hgt;

	/* Verify location */
	if ((x < 0) || (x >= w)) return (-1);
	if ((y < 0) || (y >= h)) return (-1);

	/* Paranoia -- illegal char */
	if (!c) return (-2);

	/* Queue it for later */
	Term_queue_char(Term, x, y, a, c, 0, 0);

	/* Success */
	return (0);
}